

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avi_rw.cpp
# Opt level: O3

void read_chunk(FILE *file,Chunk *chunk,uint32_t node,uint32_t *bytes)

{
  if (node == 0) {
    fread(chunk,4,1,(FILE *)file);
    *bytes = *bytes - 4;
  }
  else {
    chunk->ckID = node;
  }
  fread(&chunk->ckSize,4,1,(FILE *)file);
  *bytes = *bytes - 4;
  return;
}

Assistant:

void read_chunk(FILE *file, Chunk &chunk, uint32_t node, uint32_t &bytes) {
    if (node == 0) {
        fread(&(chunk.ckID), sizeof(chunk.ckID), 1, file);
        bytes -= sizeof(chunk.ckID);
    } else {
        chunk.ckID = node;
    }
    fread(&(chunk.ckSize), sizeof(chunk.ckSize), 1, file);
    bytes -= sizeof(chunk.ckSize);
}